

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

string_view __thiscall stream_buffer::next_token(stream_buffer *this)

{
  byte bVar1;
  char cVar2;
  size_t sVar3;
  istream *piVar4;
  size_t sVar5;
  int iVar6;
  char *pcVar7;
  byte bVar8;
  size_t sVar9;
  uint uVar10;
  string_view sVar11;
  
  iVar6 = this->current_token_buffer;
  if ((this->token)._M_elems[iVar6].buffer[(this->token)._M_elems[iVar6].current] == '\0') {
    iVar6 = (iVar6 + 1) % 10;
    this->current_token_buffer = iVar6;
    sVar5 = 0;
    pcVar7 = (char *)0x0;
    if (*(int *)(this->is + *(long *)(*(long *)this->is + -0x18) + 0x20) != 0) goto LAB_00136a2f;
    (this->token)._M_elems[iVar6].buffer[0] = '\0';
    while( true ) {
      piVar4 = this->is;
      std::__istream_extract(piVar4,(this->token)._M_elems[this->current_token_buffer].buffer,0x200)
      ;
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      cVar2 = (this->token)._M_elems[this->current_token_buffer].buffer[0];
      if (cVar2 != '\0') {
        if (cVar2 != '\\') break;
        std::istream::ignore((long)this->is,-1);
      }
    }
    iVar6 = this->current_token_buffer;
    (this->token)._M_elems[iVar6].current = 0;
    if ((this->token)._M_elems[iVar6].buffer[0] != '\0') goto LAB_00136814;
  }
  else {
LAB_00136814:
    iVar6 = this->current_token_buffer;
    sVar3 = (this->token)._M_elems[iVar6].current;
    bVar1 = (this->token)._M_elems[iVar6].buffer[sVar3];
    if (bVar1 != 0) {
      pcVar7 = (this->token)._M_elems[iVar6].buffer + sVar3;
      (this->token)._M_elems[iVar6].current = sVar3 + 1;
      sVar5 = 1;
      uVar10 = (byte)(this->token)._M_elems[iVar6].buffer[sVar3] - 0x2a;
      if (((0x34 < uVar10) || ((0x1a0000001d000bU >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
         ((this->token)._M_elems[iVar6].buffer[sVar3 + 1] != '\0')) {
        sVar5 = (this->token)._M_elems[iVar6].current;
        bVar8 = (this->token)._M_elems[iVar6].buffer[sVar5];
        if (bVar8 != 0) {
          sVar9 = sVar5;
          do {
            sVar5 = sVar9;
            if (((bVar8 - 0x2a < 0x35) &&
                ((0x1a0000001d000bU >> ((ulong)(bVar8 - 0x2a) & 0x3f) & 1) != 0)) ||
               (((((int)(char)bVar1 - 0x30U < 10 ||
                  ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)))) &&
                 (9 < (int)(char)bVar8 - 0x30U)) &&
                ((0x3a < bVar8 - 0x2b ||
                 ((0x40000000400000dU >> ((ulong)(bVar8 - 0x2b) & 0x3f) & 1) == 0)))))) break;
            sVar5 = sVar9 + 1;
            (this->token)._M_elems[iVar6].current = sVar5;
            bVar8 = (this->token)._M_elems[iVar6].buffer[sVar9 + 1];
            sVar9 = sVar5;
          } while (bVar8 != 0);
        }
        sVar5 = sVar5 - sVar3;
      }
      goto LAB_00136a2f;
    }
  }
  sVar5 = 0;
  pcVar7 = (char *)0x0;
LAB_00136a2f:
  sVar11._M_str = pcVar7;
  sVar11._M_len = sVar5;
  return sVar11;
}

Assistant:

std::string_view next_token() noexcept
    {
        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0') {
            current_token_buffer =
              (current_token_buffer + 1) % stream_buffer_size;
            if (!is.good())
                return std::string_view();

            token[current_token_buffer].buffer[0] = '\0';
            while (is >> token[current_token_buffer].buffer) {
                if (token[current_token_buffer].buffer[0] == '\\') {
                    is.ignore(std::numeric_limits<std::streamsize>::max(),
                              '\n');
                    continue;
                }

                if (token[current_token_buffer].buffer[0] == '\0')
                    continue;

                break;
            }

            token[current_token_buffer].current = 0;
            if (token[current_token_buffer].buffer[0] == '\0')
                return std::string_view();
        }

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view();

        bool starts_with_number =
          starts_with_a_number(token[current_token_buffer]
                                 .buffer[token[current_token_buffer].current]);

        std::size_t start = token[current_token_buffer].current++;

        if (is_separator(token[current_token_buffer].buffer[start]))
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        if (token[current_token_buffer]
              .buffer[token[current_token_buffer].current] == '\0')
            return std::string_view(&token[current_token_buffer].buffer[start],
                                    1);

        while (token[current_token_buffer]
                 .buffer[token[current_token_buffer].current] != '\0') {
            if (is_separator(token[current_token_buffer]
                               .buffer[token[current_token_buffer].current]))
                break;

            if (starts_with_number &&
                !is_number(token[current_token_buffer]
                             .buffer[token[current_token_buffer].current]))
                break;

            ++token[current_token_buffer].current;
        }

        return std::string_view(&token[current_token_buffer].buffer[start],
                                token[current_token_buffer].current - start);
    }